

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_GlobalScan_Test::TestBody(MxxReduce_GlobalScan_Test *this)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  size_t i;
  long lVar4;
  size_type sVar5;
  int *piVar6;
  char *pcVar7;
  size_type __n;
  long lVar8;
  int *piVar9;
  bool bVar10;
  datatype dt;
  comm nonzero_comm;
  vector<int,_std::allocator<int>_> local;
  AssertionResult gtest_ar;
  MPI_Datatype local_c0;
  MPI_Op local_b8;
  undefined4 local_ac;
  vector<int,_std::allocator<int>_> result;
  vector<int,_std::allocator<int>_> local_cpy;
  int local_74;
  comm local_70;
  comm c;
  
  mxx::comm::comm(&c);
  if ((c.m_rank & 1U) == 0) {
    __n = (long)(c.m_rank >> 1) + 1;
    iVar3 = (int)((long)(c.m_rank >> 1) * __n >> 1);
  }
  else {
    iVar3 = 0;
    __n = 0;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local,__n,(allocator_type *)&gtest_ar);
  for (sVar5 = 0; __n != sVar5; sVar5 = sVar5 + 1) {
    local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sVar5] = iVar3 + 1 + (int)sVar5;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_cpy,&local);
  mxx::global_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,&c);
  lVar8 = 0;
  sVar5 = __n;
  while (bVar10 = sVar5 != 0, sVar5 = sVar5 - 1, bVar10) {
    dt._vptr_datatype =
         (_func_int **)
         CONCAT44(dt._vptr_datatype._4_4_,
                  ((*(int *)((long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar8) + 1) *
                  *(int *)((long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar8)) / 2);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"local[i]*(local[i]+1)/2","local_cpy[i]",(int *)&dt,
               (int *)((long)local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar8));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&dt);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&nonzero_comm,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0x109,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&nonzero_comm,(Message *)&dt);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nonzero_comm);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&dt);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      goto LAB_0010d527;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar8 = lVar8 + 4;
  }
  mxx::comm::comm(&local_70);
  std::vector<int,_std::allocator<int>_>::vector
            (&result,(long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2,(allocator_type *)&gtest_ar);
  piVar2 = result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar9 = local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar8 = (long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
  mxx::comm::split(&nonzero_comm,&local_70,(uint)(lVar8 != 0));
  if (piVar1 != piVar9) {
    iVar3 = *piVar9;
    *piVar2 = iVar3;
    piVar6 = piVar2;
    while( true ) {
      piVar6 = piVar6 + 1;
      piVar9 = piVar9 + 1;
      if (piVar9 == piVar1) break;
      iVar3 = iVar3 + *piVar9;
      *piVar6 = iVar3;
    }
    local_ac = *(undefined4 *)((long)piVar2 + lVar8 + -4);
    gtest_ar._0_8_ = &PTR__custom_op_00142cc8;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    dt.builtin = false;
    dt._17_7_ = 0;
    dt._vptr_datatype = (_func_int **)0x0;
    dt.mpitype = (MPI_Datatype)0x0;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x10);
    ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p =
         (pointer)mxx::custom_op<int>::custom_function<MxxReduce_GlobalScan_Test::TestBody()::__0>;
    dt._vptr_datatype = (_func_int **)0x0;
    dt.mpitype = (MPI_Datatype)0x0;
    dt.builtin = false;
    dt._17_7_ = 0;
    std::_Function_base::~_Function_base((_Function_base *)&dt);
    dt._vptr_datatype = (_func_int **)&PTR__datatype_00142cf8;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt.builtin = true;
    MPI_Type_dup(&ompi_mpi_int,&local_c0);
    local_74 = 0x543;
    mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
              (&local_c0,&local_74,
               (function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)&gtest_ar.message_);
    MPI_Op_create(mxx::custom_op<int>::mpi_user_function,1,&local_b8);
    mxx::datatype::~datatype(&dt);
    MPI_Exscan(&local_ac,&dt,1,local_c0,local_b8,nonzero_comm.mpi_comm);
    iVar3 = nonzero_comm.m_rank;
    if (nonzero_comm.m_rank != 0) {
      iVar3 = (int)dt._vptr_datatype;
    }
    mxx::custom_op<int>::~custom_op((custom_op<int> *)&gtest_ar);
    if (nonzero_comm.m_rank != 0) {
      for (lVar4 = 0; lVar8 >> 2 != lVar4; lVar4 = lVar4 + 1) {
        piVar2[lVar4] = piVar2[lVar4] + iVar3;
      }
    }
  }
  mxx::comm::~comm(&nonzero_comm);
  mxx::comm::~comm(&local_70);
  dt._vptr_datatype =
       (_func_int **)
       ((long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2);
  nonzero_comm._vptr_comm =
       (_func_int **)
       ((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"local.size()","result.size()",(unsigned_long *)&dt,
             (unsigned_long *)&nonzero_comm);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&dt);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nonzero_comm,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0x10e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nonzero_comm,(Message *)&dt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nonzero_comm);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&dt);
LAB_0010d515:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar8 = 0;
    while (bVar10 = __n != 0, __n = __n - 1, bVar10) {
      dt._vptr_datatype =
           (_func_int **)
           CONCAT44(dt._vptr_datatype._4_4_,
                    ((*(int *)((long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8) + 1) *
                    *(int *)((long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar8)) / 2);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"local[i]*(local[i]+1)/2","result[i]",(int *)&dt,
                 (int *)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar8));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&dt);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&nonzero_comm,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0x110,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&nonzero_comm,(Message *)&dt);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nonzero_comm);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&dt);
        goto LAB_0010d515;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar8 = lVar8 + 4;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&result.super__Vector_base<int,_std::allocator<int>_>);
LAB_0010d527:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_cpy.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local.super__Vector_base<int,_std::allocator<int>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxReduce, GlobalScan) {
    mxx::comm c;
    // test scan with zero elements for some processes
    size_t n = 0;
    int presize = 0;
    if (c.rank() % 2 == 0) {
        n = (c.rank()/2+1);
        presize = n*(n-1)/2;
    }
    std::vector<int> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = presize + i + 1;
    }
    // test inplace scan
    std::vector<int> local_cpy(local);
    mxx::global_scan_inplace(local_cpy.begin(), local_cpy.end(), c);
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]+1)/2, local_cpy[i]);
    }
    // test scan
    //std::vector<int> result(local.size());
    std::vector<int> result = mxx::global_scan(local, [](int x, int y) {return x+y;});
    ASSERT_EQ(local.size(), result.size());
    for (size_t i = 0; i < n; ++i) {
        ASSERT_EQ(local[i]*(local[i]+1)/2, result[i]);
    }
}